

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O2

void __thiscall imrt::Collimator::printIntensityLevels(Collimator *this)

{
  pointer piVar1;
  ostream *poVar2;
  int i;
  ulong uVar3;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Intensity levels: ");
  std::endl<char,std::char_traits<char>>(poVar2);
  for (uVar3 = 0;
      piVar1 = (this->levels_to_intensity).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->levels_to_intensity).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
      uVar3 = uVar3 + 1) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,piVar1[uVar3]);
    std::operator<<(poVar2," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void Collimator::printIntensityLevels (){
    cout << "Intensity levels: "<< endl;
    for (int i=0; i<levels_to_intensity.size(); i++){
      cout << levels_to_intensity[i] <<  " ";
    }
    cout << endl;
  }